

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<long>::test_one<(libdivide::Branching)1>
          (DivideTest<long> *this,long numer,long denom,
          divider<long,_(libdivide::Branching)1> *the_divider)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  string_class local_50;
  
  if (denom != -1 || numer != -0x8000000000000000) {
    bVar1 = (the_divider->div).denom.more;
    lVar3 = (the_divider->div).denom.magic;
    lVar2 = SUB168(SEXT816(lVar3) * SEXT816(numer),8) + numer;
    lVar3 = ((long)((lVar2 >> 0x3f & (1L << ((ulong)bVar1 & 0x3f)) - (ulong)(lVar3 == 0)) + lVar2)
             >> ((ulong)bVar1 & 0x3f) ^ (long)((char)bVar1 >> 7)) - (long)((char)bVar1 >> 7);
    if (lVar3 != numer / denom) {
      std::operator<<((ostream *)&std::cerr,"Failure for ");
      testcase_name_abi_cxx11_(&local_50,this,1);
      std::operator<<((ostream *)&std::cerr,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,numer);
      std::operator<<((ostream *)&std::cerr," / ");
      std::ostream::operator<<((ostream *)&std::cerr,denom);
      std::operator<<((ostream *)&std::cerr," = ");
      std::ostream::operator<<((ostream *)&std::cerr,numer / denom);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,lVar3);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
  }
  return;
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }